

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_1::BufferViewTestInstance::~BufferViewTestInstance
          (BufferViewTestInstance *this)

{
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BufferViewTestInstance_00bca990;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->m_resultBufferAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&(this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            (&(this->m_graphicsPipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->m_vertexBufferAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&(this->m_vertices).
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            (&(this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            (&(this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase
            (&(this->m_uniformBufferView).super_RefBase<vk::Handle<(vk::HandleType)12>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->m_uniformBufferAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&(this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            (&(this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->m_colorImageAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  return;
}

Assistant:

BufferViewTestInstance::~BufferViewTestInstance	(void)
{
}